

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O2

void readRgba1(char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *width,int *height)

{
  int scanLine1;
  int scanLine2;
  int iVar1;
  Box2i *pBVar2;
  long sizeX;
  RgbaInputFile file;
  
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&file,fileName,iVar1);
  pBVar2 = Imf_2_5::RgbaInputFile::dataWindow(&file);
  iVar1 = (pBVar2->min).x;
  scanLine1 = (pBVar2->min).y;
  scanLine2 = (pBVar2->max).y;
  *width = ((pBVar2->max).x - iVar1) + 1;
  sizeX = ((long)scanLine2 - (long)scanLine1) + 1;
  *height = (int)sizeX;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase(pixels,sizeX,(long)*width);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (&file,pixels->_data + (-(long)iVar1 - (long)*width * (long)scanLine1),1,(long)*width);
  Imf_2_5::RgbaInputFile::readPixels(&file,scanLine1,scanLine2);
  Imf_2_5::RgbaInputFile::~RgbaInputFile(&file);
  return;
}

Assistant:

void
readRgba1 (const char fileName[],
	   Array2D<Rgba> &pixels,
	   int &width,
	   int &height)
{
    //
    // Read an RGBA image using class RgbaInputFile:
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the memory layout of the pixels
    //	- read the pixels from the file
    //

    RgbaInputFile file (fileName);
    Box2i dw = file.dataWindow();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);
    file.readPixels (dw.min.y, dw.max.y);
}